

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O2

void __thiscall
KryoFlux::ReadFlux(KryoFlux *this,int revs,FluxData *flux_revs,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *warnings)

{
  int iVar1;
  int iVar2;
  Data chunk;
  Data track_data;
  FluxData local_88;
  string local_70 [32];
  string local_50 [32];
  
  iVar1 = 0x14;
  if (revs < 0x14) {
    iVar1 = revs;
  }
  iVar2 = 1;
  if (1 < iVar1) {
    iVar2 = iVar1;
  }
  track_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  track_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  track_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (&track_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,1000000);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&chunk.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0x10000,
             (allocator_type *)&local_88);
  (**(code **)(*(long *)this + 0x38))(this);
  (**(code **)(*(long *)this + 0x18))(local_50,this,0xb,iVar2 * 0x100 + 0x101,0);
  std::__cxx11::string::~string(local_50);
  do {
    do {
      iVar1 = (**(code **)(*(long *)this + 0x30))
                        (this,chunk.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                         (int)chunk.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                         (int)chunk.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&track_data,
                 (const_iterator)
                 track_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )chunk.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(chunk.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start + iVar1));
    } while (iVar1 < 7);
    iVar1 = bcmp(chunk.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + (long)iVar1 + -7,"\r\r\r\r\r\r\r",7);
  } while (iVar1 != 0);
  (**(code **)(*(long *)this + 0x18))(local_70,this,0xb,0,0);
  std::__cxx11::string::~string(local_70);
  (**(code **)(*(long *)this + 0x40))(this);
  DecodeStream(&local_88,&track_data,warnings);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::_M_move_assign(flux_revs,&local_88);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&chunk);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&track_data);
  return;
}

Assistant:

void KryoFlux::ReadFlux(int revs, FluxData& flux_revs, std::vector<std::string>& warnings)
{
    revs = std::max(1, std::min(revs, 20));

    Data track_data;
    track_data.reserve(1'000'000);
    Data chunk(0x10000);

    // Start reading before we ask for the bulk data.
    StartAsyncRead();

    // Start stream, for 1 more index hole than we require revolutions
    Control(REQ_STREAM, ((revs + 1) << 8) | 0x01);

    for (;;)
    {
        auto len = ReadAsync(chunk.data(), chunk.size());
        track_data.insert(track_data.end(), chunk.begin(), chunk.begin() + len);

        // Check for end marker at end of current packet.
        // ToDo: parse this properly, due to small risk of false positives.
        if (len >= 7 && !memcmp(chunk.data() + len - 7, "\xd\xd\xd\xd\xd\xd\xd", 7))
        {
            // Stop streaming and finish
            Control(REQ_STREAM, 0);
            StopAsyncRead();
            break;
        }
    }

    // Decode the track data to multiple flux revolutions, plus any warnings
    flux_revs = DecodeStream(track_data, warnings);
}